

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DigitalPhaseLockedLoop.hpp
# Opt level: O0

void __thiscall
Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL>::post_phase_offset
          (DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL> *this,IntType new_phase,
          IntType new_offset)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  reference pvVar4;
  long *plVar5;
  size_type sVar6;
  IntType error;
  long local_78;
  long local_70;
  value_type offset;
  iterator __end0;
  iterator __begin0;
  array<Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL>::LoggedOffset,_3UL>
  *__range2;
  IntType ts;
  IntType td;
  long local_30;
  long local_28;
  long multiple;
  IntType new_offset_local;
  IntType new_phase_local;
  DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL> *this_local;
  
  multiple = new_offset;
  new_offset_local = new_phase;
  new_phase_local = (IntType)this;
  pvVar4 = std::
           array<Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL>::LoggedOffset,_3UL>
           ::operator[](&this->offset_history_,this->offset_history_pointer_);
  this->total_divisor_ = this->total_divisor_ - pvVar4->divisor;
  pvVar4 = std::
           array<Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL>::LoggedOffset,_3UL>
           ::operator[](&this->offset_history_,this->offset_history_pointer_);
  this->total_spacing_ = this->total_spacing_ - pvVar4->spacing;
  local_30 = (multiple + (this->clocks_per_bit_ >> 1)) / (long)this->clocks_per_bit_;
  td = 1;
  plVar5 = std::max<long>(&local_30,&td);
  lVar1 = *plVar5;
  local_28 = lVar1;
  pvVar4 = std::
           array<Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL>::LoggedOffset,_3UL>
           ::operator[](&this->offset_history_,this->offset_history_pointer_);
  lVar3 = multiple;
  pvVar4->divisor = lVar1;
  pvVar4 = std::
           array<Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL>::LoggedOffset,_3UL>
           ::operator[](&this->offset_history_,this->offset_history_pointer_);
  pvVar4->spacing = lVar3;
  pvVar4 = std::
           array<Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL>::LoggedOffset,_3UL>
           ::operator[](&this->offset_history_,this->offset_history_pointer_);
  this->total_divisor_ = pvVar4->divisor + this->total_divisor_;
  pvVar4 = std::
           array<Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL>::LoggedOffset,_3UL>
           ::operator[](&this->offset_history_,this->offset_history_pointer_);
  this->total_spacing_ = pvVar4->spacing + this->total_spacing_;
  sVar2 = this->offset_history_pointer_;
  sVar6 = std::
          array<Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL>::LoggedOffset,_3UL>
          ::size(&this->offset_history_);
  this->offset_history_pointer_ = (sVar2 + 1) % sVar6;
  ts = 0;
  __range2 = (array<Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL>::LoggedOffset,_3UL>
              *)0x0;
  __end0 = std::
           array<Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL>::LoggedOffset,_3UL>
           ::begin(&this->offset_history_);
  offset.spacing =
       (IntType)std::
                array<Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL>::LoggedOffset,_3UL>
                ::end(&this->offset_history_);
  for (; __end0 != (iterator)offset.spacing; __end0 = __end0 + 1) {
    local_70 = __end0->divisor;
    offset.divisor = __end0->spacing;
    ts = local_70 + ts;
    __range2 = (array<Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL>::LoggedOffset,_3UL>
                *)((long)&__range2->_M_elems[0].divisor + offset.divisor);
  }
  if (__range2 ==
      (array<Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL>::LoggedOffset,_3UL> *)
      this->total_spacing_) {
    if (ts == this->total_divisor_) {
      local_78 = this->total_spacing_ / this->total_divisor_;
      error = 1;
      plVar5 = std::max<long>(&local_78,&error);
      this->window_length_ = *plVar5;
      this->phase_ = this->phase_ - ((new_offset_local - (this->window_length_ >> 1)) + 1 >> 1);
      return;
    }
    __assert_fail("td == total_divisor_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/Controller/../DPLL/DigitalPhaseLockedLoop.hpp"
                  ,0x67,
                  "void Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller>::post_phase_offset(Cycles::IntType, Cycles::IntType) [BitHandler = Storage::Disk::Controller, length_of_history = 3]"
                 );
  }
  __assert_fail("ts == total_spacing_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/Controller/../DPLL/DigitalPhaseLockedLoop.hpp"
                ,0x66,
                "void Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller>::post_phase_offset(Cycles::IntType, Cycles::IntType) [BitHandler = Storage::Disk::Controller, length_of_history = 3]"
               );
}

Assistant:

void post_phase_offset(Cycles::IntType new_phase, Cycles::IntType new_offset) {
			// Erase the effect of whatever is currently in this slot.
			total_divisor_ -= offset_history_[offset_history_pointer_].divisor;
			total_spacing_ -= offset_history_[offset_history_pointer_].spacing;

			// Fill in the new fields.
			const auto multiple = std::max((new_offset + (clocks_per_bit_ >> 1)) / clocks_per_bit_, Cycles::IntType(1));
			offset_history_[offset_history_pointer_].divisor = multiple;
			offset_history_[offset_history_pointer_].spacing = new_offset;

			// Add in the new values;
			total_divisor_ += offset_history_[offset_history_pointer_].divisor;
			total_spacing_ += offset_history_[offset_history_pointer_].spacing;

			// Advance the write slot.
			offset_history_pointer_ = (offset_history_pointer_ + 1) % offset_history_.size();

#ifndef NDEBUG
			Cycles::IntType td = 0, ts = 0;
			for(auto offset: offset_history_) {
				td += offset.divisor;
				ts += offset.spacing;
			}
			assert(ts == total_spacing_);
			assert(td == total_divisor_);
#endif

			// In net: use an unweighted average of the stored offsets to compute current window size,
			// bucketing them by rounding to the nearest multiple of the base clocks per bit
			window_length_ = std::max(total_spacing_ / total_divisor_, Cycles::IntType(1));

			// Also apply a difference to phase, use a simple spring mechanism as a lowpass filter.
			const auto error = new_phase - (window_length_ >> 1);
			phase_ -= (error + 1) >> 1;
		}